

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

int tokthfind(toktdef *tab1,int typ,uint val,toksdef *ret)

{
  int iVar1;
  undefined8 in_RCX;
  int i;
  tokseadef ctx;
  int local_6c;
  void *in_stack_ffffffffffffffc0;
  _func_int_void_ptr_toksdef_ptr_mcmon *in_stack_ffffffffffffffc8;
  tokthdef *in_stack_ffffffffffffffd8;
  
  local_6c = 0;
  while( true ) {
    if (0xff < local_6c) {
      return 0;
    }
    iVar1 = tokthscan(in_stack_ffffffffffffffd8,(uint)((ulong)in_RCX >> 0x20),
                      in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (iVar1 != 0) break;
    local_6c = local_6c + 1;
  }
  return 1;
}

Assistant:

int tokthfind(toktdef *tab1, int typ, uint val, toksdef *ret)
{
    tokseadef ctx;
    int       i;
    
    ctx.tokseasym.tokstyp = typ;
    ctx.tokseasym.toksval = val;
    ctx.toksearet = ret;
    
    for (i = 0 ; i < TOKHASHSIZE ; ++i)
    {
        if (tokthscan((tokthdef *)tab1, i, tokthfind1, &ctx))
            return(TRUE);
    }
    return(FALSE);
}